

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++:1305:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:1305:17)>
             *this)

{
  ThreadId *pTVar1;
  ThreadId *this_00;
  bool bVar2;
  DebugExpression<bool> _kjCondition_2;
  ThreadId id3;
  DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> _kjCondition;
  undefined8 local_4a0;
  undefined8 local_498;
  Fault f;
  StringPtr local_1a0 [25];
  
  id3 = ThreadId::current();
  ThreadId::assertCurrentThread(&id3);
  _kjCondition.left = (this->f).id1;
  bVar2 = (_kjCondition.left)->id == id3.id;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = !bVar2;
  _kjCondition.right = &id3;
  if (bVar2) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ThreadId&,kj::ThreadId&>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x51c,FAILED,"id1 != id3","_kjCondition,",&_kjCondition);
    _::Debug::Fault::fatal(&f);
  }
  pTVar1 = (this->f).id2;
  _kjCondition.result = pTVar1->id != id3.id;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    _kjCondition.left = pTVar1;
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ThreadId&,kj::ThreadId&>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x51d,FAILED,"id2 != id3","_kjCondition,",&_kjCondition);
    _::Debug::Fault::fatal(&f);
  }
  this_00 = _kjCondition.left;
  _kjCondition.left = pTVar1;
  ThreadId::assertCurrentThread(this_00);
  f.exception = f.exception & 0xffffffffffffff00;
  _::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition,(NullableValue<kj::Exception> *)&f);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
  if ((char)_kjCondition.left == '\x01') {
    if (local_498 == 0) {
      local_4a0 = "";
    }
    local_1a0[0].content.ptr = "expected id == &currentThreadId";
    local_1a0[0].content.size_ = 0x20;
    f.exception = (Exception *)local_4a0;
    _kjCondition_2.value = StringPtr::contains((StringPtr *)&f,local_1a0);
    if (_::Debug::minSeverity < 3 && !_kjCondition_2.value) {
      _::Debug::
      log<char_const(&)[80],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x51f,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"expected id == &currentThreadId\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [80])
                  "failed: expected e.getDescription().contains(\"expected id == &currentThreadId\")"
                 ,&_kjCondition_2,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (Exception *)&_kjCondition.right);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x51f,ERROR,"\"code did not throw: \" \"id1.assertCurrentThread()\"",
               (char (*) [46])"code did not throw: id1.assertCurrentThread()");
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }